

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

_Bool op_div(DisasContext_conflict1 *s,arg_rrr *a,_Bool u)

{
  uint uVar1;
  TCGContext_conflict1 *tcg_ctx;
  _Bool _Var2;
  TCGv_i32 var;
  TCGv_i32 pTVar3;
  code *func;
  TCGTemp *local_48;
  TCGTemp *local_40;
  
  tcg_ctx = s->uc->tcg_ctx;
  uVar1 = s->isar->id_isar0;
  if (s->thumb == 0) {
    uVar1 = uVar1 & 0xe000000;
  }
  else {
    uVar1 = uVar1 & 0xf000000;
  }
  if (uVar1 == 0) {
    _Var2 = false;
  }
  else {
    var = load_reg(s,a->rn);
    pTVar3 = load_reg(s,a->rm);
    local_48 = (TCGTemp *)(var + (long)tcg_ctx);
    if (u) {
      func = helper_udiv_aarch64;
    }
    else {
      func = helper_sdiv_aarch64;
    }
    local_40 = (TCGTemp *)(pTVar3 + (long)tcg_ctx);
    tcg_gen_callN_aarch64(tcg_ctx,func,local_48,2,&local_48);
    tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(pTVar3 + (long)tcg_ctx));
    store_reg(s,a->rd,var);
    _Var2 = true;
  }
  return _Var2;
}

Assistant:

static bool op_div(DisasContext *s, arg_rrr *a, bool u)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv_i32 t1, t2;

    if (s->thumb
        ? !dc_isar_feature(aa32_thumb_div, s)
        : !dc_isar_feature(aa32_arm_div, s)) {
        return false;
    }

    t1 = load_reg(s, a->rn);
    t2 = load_reg(s, a->rm);
    if (u) {
        gen_helper_udiv(tcg_ctx, t1, t1, t2);
    } else {
        gen_helper_sdiv(tcg_ctx, t1, t1, t2);
    }
    tcg_temp_free_i32(tcg_ctx, t2);
    store_reg(s, a->rd, t1);
    return true;
}